

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

void CopyASETexture(aiMaterial *mat,Texture *texture,aiTextureType type)

{
  ulong __n;
  _IEEESingle temp;
  aiString tex;
  
  tex.length = 0;
  tex.data[0] = '\0';
  memset(tex.data + 1,0x1b,0x3ff);
  __n = (texture->mMapName)._M_string_length;
  if (__n < 0x400) {
    tex.length = (ai_uint32)__n;
    memcpy(tex.data,(texture->mMapName)._M_dataplus._M_p,__n);
    tex.data[__n] = '\0';
  }
  aiMaterial::AddProperty(mat,&tex,"$tex.file",type,0);
  if ((~(uint)texture->mTextureBlend & 0x7f800000) != 0 ||
      ((uint)texture->mTextureBlend & 0x7fffff) == 0) {
    aiMaterial::AddProperty<float>(mat,&texture->mTextureBlend,1,"$tex.blend",type,0);
  }
  aiMaterial::AddProperty<float>(mat,&texture->mOffsetU,5,"$tex.uvtrafo",type,0);
  return;
}

Assistant:

void CopyASETexture(aiMaterial& mat, ASE::Texture& texture, aiTextureType type)
{
    // Setup the texture name
    aiString tex;
    tex.Set( texture.mMapName);
    mat.AddProperty( &tex, AI_MATKEY_TEXTURE(type,0));

    // Setup the texture blend factor
    if (is_not_qnan(texture.mTextureBlend))
        mat.AddProperty<ai_real>( &texture.mTextureBlend, 1, AI_MATKEY_TEXBLEND(type,0));

    // Setup texture UV transformations
    mat.AddProperty<ai_real>(&texture.mOffsetU,5,AI_MATKEY_UVTRANSFORM(type,0));
}